

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Picture.cpp
# Opt level: O3

Color * __thiscall Picture::getColor(Color *__return_storage_ptr__,Picture *this,double x,double y)

{
  int iVar1;
  Vec3b *pVVar2;
  int iVar3;
  int iVar4;
  Color *pCVar5;
  bool bVar6;
  undefined8 uVar7;
  int i;
  long lVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  ushort local_8c;
  byte local_8a;
  int local_88;
  uint local_84;
  Color *local_80;
  double local_78;
  double local_70;
  Vector3 local_68;
  Vector3 local_48;
  
  dVar14 = 0.0;
  if (0.0 <= x) {
    dVar14 = x;
  }
  local_78 = 1.0;
  if (dVar14 <= 1.0) {
    local_78 = dVar14;
  }
  dVar14 = 0.0;
  if (0.0 <= y) {
    dVar14 = y;
  }
  dVar13 = 1.0;
  if (dVar14 <= 1.0) {
    dVar13 = dVar14;
  }
  local_70 = (double)(this->rows + -1) * (1.0 - dVar13);
  local_78 = (double)(this->cols + -1) * local_78;
  local_88 = (int)local_70;
  iVar12 = (int)local_78;
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 0.0;
  iVar10 = 0;
  uVar7 = CONCAT71((uint7)(uint3)((uint)local_88 >> 8),1);
  local_80 = __return_storage_ptr__;
  do {
    local_84 = (uint)uVar7;
    iVar10 = iVar10 + local_88;
    iVar9 = 0;
    bVar6 = true;
    do {
      bVar11 = bVar6;
      iVar1 = this->cols;
      iVar3 = this->rows;
      if (iVar10 <= this->rows) {
        iVar3 = iVar10;
      }
      iVar4 = iVar9 + iVar12;
      if (iVar1 < iVar9 + iVar12) {
        iVar4 = iVar1;
      }
      pVVar2 = this->data;
      lVar8 = 0;
      do {
        iVar9 = (int)ROUND((double)pVVar2[(long)(iVar3 * iVar1) + (long)iVar4].
                                   super_Matx<unsigned_char,_3,_1>.val[lVar8] *
                           (1.0 - ABS(local_78 - (double)iVar4)) *
                           (1.0 - ABS(local_70 - (double)iVar3)));
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        *(char *)((long)&local_8c + lVar8) = (char)iVar9;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      local_68.x = (double)(local_8c & 0xff);
      local_68.y = (double)(byte)(local_8c >> 8);
      local_68.z = (double)local_8a;
      operator+=(&local_48,&local_68);
      pCVar5 = local_80;
      iVar9 = 1;
      bVar6 = false;
    } while (bVar11);
    iVar10 = 1;
    uVar7 = 0;
  } while ((local_84 & 1) != 0);
  local_68.x = 255.0;
  operator/(&local_48,&local_68.x);
  return pCVar5;
}

Assistant:

Color Picture::getColor(double x, double y) const
{
    x = min(max(x, 0.), 1.);
    y = min(max(y, 0.), 1.);
    y = (1 - y) * (rows - 1);
    x = x * (cols - 1);
    Color res;
    for (int i = 0; i < 2; ++i)
        for (int j = 0; j < 2; ++j) {
            int ny = std::min(int(y) + i, this->rows);
            int nx = std::min(int(x) + j, this->cols);
            res += (1 - fabs(y - ny)) * (1 - fabs(x - nx)) * (*this)[ny][nx];
        }
    return res / 255;
}